

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O0

void __thiscall
ThreadContext::QueueFreeOldEntryPointInfoIfInScript
          (ThreadContext *this,FunctionEntryPointInfo *oldEntryPointInfo)

{
  bool bVar1;
  FunctionEntryPointInfo **ppFVar2;
  RecyclableData *pRVar3;
  FunctionEntryPointInfo *oldEntryPointInfo_local;
  ThreadContext *this_local;
  
  bVar1 = IsInScript(this);
  if (((bVar1) &&
      (ppFVar2 = Memory::WriteBarrierPtr::operator_cast_to_FunctionEntryPointInfo__
                           ((WriteBarrierPtr *)&oldEntryPointInfo->nextEntryPoint),
      *ppFVar2 == (FunctionEntryPointInfo *)0x0)) &&
     (bVar1 = Js::EntryPointInfo::IsCleanedUp(&oldEntryPointInfo->super_EntryPointInfo), !bVar1)) {
    pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::operator=
              (&oldEntryPointInfo->nextEntryPoint,&pRVar3->oldEntryPointInfo);
    pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::operator=
              (&pRVar3->oldEntryPointInfo,oldEntryPointInfo);
  }
  return;
}

Assistant:

void QueueFreeOldEntryPointInfoIfInScript(Js::FunctionEntryPointInfo* oldEntryPointInfo)
    {
        if (this->IsInScript())
        {
            // Add it to the list only if it's not already in it
            if (oldEntryPointInfo->nextEntryPoint == nullptr && !oldEntryPointInfo->IsCleanedUp())
            {
                oldEntryPointInfo->nextEntryPoint = recyclableData->oldEntryPointInfo;
                recyclableData->oldEntryPointInfo = oldEntryPointInfo;
            }
        }
    }